

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::NumSamplesTest::build(NumSamplesTest *this,FboBuilder *builder)

{
  GLenum attPoint;
  uint uVar1;
  int iVar2;
  ImageFormat format;
  ImageFormat IVar3;
  GLuint GVar4;
  deBool dVar5;
  GLenum GVar6;
  Renderbuffer *rbCfg;
  NotSupportedError *this_00;
  RenderbufferAttachment *att_00;
  RenderbufferAttachment *att;
  GLuint rbo;
  Renderbuffer *rboCfg;
  GLsizei ns;
  ImageFormat fmt;
  GLenum target;
  int i;
  FboBuilder *builder_local;
  NumSamplesTest *this_local;
  
  fmt.unsizedType = 0;
  do {
    if (2 < (int)fmt.unsizedType) {
      return STOP;
    }
    attPoint = build::s_targets[(int)fmt.unsizedType];
    uVar1 = build::s_formats[(int)fmt.unsizedType];
    iVar2 = (this->super_ParamTest<deqp::gles3::Functional::NumSamplesParams>).m_params.numSamples
            [(int)fmt.unsizedType];
    if (iVar2 != -2) {
      if (iVar2 == -1) {
        format.unsizedType = 0;
        format.format = uVar1;
        deqp::gls::fboc::details::TestBase::attachTargetToNew
                  ((TestBase *)this,attPoint,0x1702,format,0x40,0x40,builder);
      }
      else {
        rbCfg = deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Renderbuffer>
                          (builder);
        IVar3.unsizedType = 0;
        IVar3.format = uVar1;
        (rbCfg->super_Image).internalFormat = IVar3;
        (rbCfg->super_Image).height = 0x40;
        (rbCfg->super_Image).width = 0x40;
        rbCfg->numSamples = iVar2;
        GVar4 = deqp::gls::FboUtil::FboBuilder::glCreateRbo(builder,rbCfg);
        do {
          dVar5 = ::deGetFalse();
          if ((dVar5 != 0) ||
             (GVar6 = deqp::gls::FboUtil::FboBuilder::getError(builder), GVar6 == 0x502)) {
            this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (this_00,"Unsupported number of samples",
                       "builder.getError() != GL_INVALID_OPERATION",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboCompletenessTests.cpp"
                       ,0x1a9);
            __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                        tcu::NotSupportedError::~NotSupportedError);
          }
          dVar5 = ::deGetFalse();
        } while (dVar5 != 0);
        att_00 = deqp::gls::FboUtil::FboBuilder::
                 makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>(builder);
        (att_00->super_Attachment).imageName = GVar4;
        deqp::gls::FboUtil::FboBuilder::glAttach(builder,attPoint,&att_00->super_Attachment);
      }
    }
    fmt.unsizedType = fmt.unsizedType + 1;
  } while( true );
}

Assistant:

IterateResult NumSamplesTest::build (FboBuilder& builder)
{
	static const GLenum s_targets[] =
		{
			GL_COLOR_ATTACHMENT0,	GL_COLOR_ATTACHMENT1,	GL_DEPTH_ATTACHMENT,
		};
	// Non-integer formats for each attachment type.
	// \todo [2013-12-17 lauri] Add fixed/floating/integer metadata for formats so
	// we can pick one smartly or maybe try several.
	static const GLenum s_formats[] =
		{
			GL_RGBA8,				GL_RGB565,				GL_DEPTH_COMPONENT24,
		};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_targets) == DE_LENGTH_OF_ARRAY(m_params.numSamples));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_targets); i++)
	{
		const GLenum target = s_targets[i];
		const ImageFormat fmt = { s_formats[i], GL_NONE };

		const GLsizei ns = m_params.numSamples[i];
		if (ns == -2)
			continue;

		if (ns == -1)
		{
			attachTargetToNew(target, GL_TEXTURE, fmt, 64, 64, builder);
		}
		else
		{
			Renderbuffer& rboCfg = builder.makeConfig<Renderbuffer>();
			rboCfg.internalFormat = fmt;
			rboCfg.width = rboCfg.height = 64;
			rboCfg.numSamples = ns;

			const GLuint rbo = builder.glCreateRbo(rboCfg);
			// Implementations do not necessarily support sample sizes greater than 1.
			TCU_CHECK_AND_THROW(NotSupportedError,
								builder.getError() != GL_INVALID_OPERATION,
								"Unsupported number of samples");
			RenderbufferAttachment& att = builder.makeConfig<RenderbufferAttachment>();
			att.imageName = rbo;
			builder.glAttach(target, &att);
		}
	}

	return STOP;
}